

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O2

void __thiscall CSocekt::inMsgRecvQueue(CSocekt *this,char *buf,int *imrqc)

{
  int iVar1;
  SourceFile file;
  MutexLockGuard lock;
  MutexLockGuard local_1010;
  char *local_1008;
  undefined1 local_1000 [12];
  Logger local_ff0;
  
  local_1010.mutex_ = &this->m_recvMessageQueueMutex;
  local_1008 = buf;
  muduo::MutexLock::lock(local_1010.mutex_);
  std::__cxx11::list<char_*,_std::allocator<char_*>_>::push_back(&this->m_MsgRecvQueue,&local_1008);
  LOCK();
  (this->m_iRecvMsgQueueCount).value_ = (this->m_iRecvMsgQueueCount).value_ + 1;
  UNLOCK();
  LOCK();
  iVar1 = (this->m_iRecvMsgQueueCount).value_;
  if (iVar1 == 0) {
    (this->m_iRecvMsgQueueCount).value_ = 0;
    iVar1 = 0;
  }
  UNLOCK();
  *imrqc = iVar1;
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<108>
              ((SourceFile *)local_1000,
               (char (*) [108])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1000._0_8_;
    file.size_ = local_1000._8_4_;
    muduo::Logger::Logger(&local_ff0,file,0x11b);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,anon_var_dwarf_30dd4);
    muduo::Logger::~Logger(&local_ff0);
  }
  muduo::MutexLockGuard::~MutexLockGuard(&local_1010);
  return;
}

Assistant:

void CSocekt::inMsgRecvQueue(char *buf, int &imrqc) //buf这段内存 ： 消息头 + 包头 + 包体
{
    muduo::MutexLockGuard lock(m_recvMessageQueueMutex);
    m_MsgRecvQueue.push_back(buf);

    m_iRecvMsgQueueCount.increment();

    imrqc = m_iRecvMsgQueueCount.get();
    
    //....其他功能待扩充，这里要记住一点，这里的内存都是要释放的，否则。。。。。。。。。。日后增加释放这些内存的代码
    //...而且逻辑处理应该要引入多线程，所以这里要考虑临界问题
    //....

    //临时在这里调用一下该函数，以防止接收消息队列过大
//    tmpoutMsgRecvQueue();   //.....临时，后续会取消这行代码

    //为了测试方便，因为本函数意味着收到了一个完整的数据包，所以这里打印一个信息
    LOG_INFO << "非常好，收到了一个完整的数据包【包头+包体】！";
}